

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_EvalHop_rec(Hop_Man_t *pHop,Hop_Obj_t *pObj,int *f,int *dc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *dc_00;
  Hop_Man_t *pHVar4;
  int dc1;
  int f1;
  int dc2;
  int f2;
  uint local_40;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 local_3c;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 local_34 [6];
  
code_r0x004d5e70:
  pHVar4 = (Hop_Man_t *)((ulong)pHop & 0xfffffffffffffffe);
  uVar1 = (pHVar4->Ghost).field_0.iData;
  uVar2 = uVar1 & 7;
  uVar3 = uVar2 - 1;
  if (3 < uVar3) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0xfc,"void Abc_FlowRetime_EvalHop_rec(Hop_Man_t *, Hop_Obj_t *, int *, int *)");
  }
  dc_00 = (int *)((long)&switchD_004d5eb0::switchdataD_009d06a8 +
                 (long)(int)(&switchD_004d5eb0::switchdataD_009d06a8)[uVar3]);
  switch(uVar2) {
  case 1:
    *(uint *)&pObj->field_0 = (uint)(pHVar4 != pHop);
    *f = 0;
    break;
  case 2:
    (pObj->field_0).iData = (uint)(pHVar4 == pHop) ^ uVar1 >> 4 & 1;
    *f = (uint)(pHVar4->Ghost).field_0.iData >> 5 & 1;
    break;
  case 3:
    goto switchD_004d5eb0_caseD_3;
  case 4:
    Abc_FlowRetime_EvalHop_rec
              ((Hop_Man_t *)pHVar4->vObjs,(Hop_Obj_t *)&local_3c,(int *)&local_40,dc_00);
    Abc_FlowRetime_EvalHop_rec
              ((Hop_Man_t *)pHVar4->pConst1,(Hop_Obj_t *)local_34,(int *)((long)&local_3c + 4),dc_00
              );
    *f = (local_40 | local_3c.iData) & local_3c._4_4_ | local_34[0].iData & local_40;
    (pObj->field_0).iData = (uint)(pHVar4 == pHop) ^ local_3c.iData & local_34[0].iData;
  }
  return;
switchD_004d5eb0_caseD_3:
  if (pHVar4 != pHop) {
    __assert_fail("pReg == pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0xec,"void Abc_FlowRetime_EvalHop_rec(Hop_Man_t *, Hop_Obj_t *, int *, int *)");
  }
  pHop = (Hop_Man_t *)pHVar4->vObjs;
  goto code_r0x004d5e70;
}

Assistant:

static void Abc_FlowRetime_EvalHop_rec( Hop_Man_t *pHop, Hop_Obj_t *pObj, int *f, int *dc ) {
  int f1, dc1, f2, dc2;
  Hop_Obj_t *pReg = Hop_Regular(pObj);
  
  // const 0
  if (Hop_ObjIsConst1(pReg)) {
    *f  = 1;
    *f ^= (pReg == pObj ? 1 : 0);
    *dc = 0;
    return;
  }

  // PI
  if (Hop_ObjIsPi(pReg)) {
    *f  = pReg->fMarkA;
    *f ^= (pReg == pObj ? 1 : 0);
    *dc = pReg->fMarkB;
    return;
  }

  // PO
  if (Hop_ObjIsPo(pReg)) {
    assert( pReg == pObj );
    Abc_FlowRetime_EvalHop_rec(pHop, Hop_ObjChild0(pReg), f, dc);
    return;
  }

  // AND
  if (Hop_ObjIsAnd(pReg)) {
    Abc_FlowRetime_EvalHop_rec(pHop, Hop_ObjChild0(pReg), &f1, &dc1);
    Abc_FlowRetime_EvalHop_rec(pHop, Hop_ObjChild1(pReg), &f2, &dc2);

    *dc = (dc1 & f2) | (dc2 & f1) | (dc1 & dc2);
    *f  = f1 & f2;
    *f ^= (pReg == pObj ? 1 : 0);
    return;
  }

  assert(0);
}